

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O0

int Saig_ManCexRefineStep
              (Aig_Man_t *p,Vec_Int_t *vFlops,Vec_Int_t *vFlopClasses,Abc_Cex_t *pCex,
              int nFfToAddMax,int fTryFour,int fSensePath,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  abctime aVar5;
  Aig_Man_t *pAbs_00;
  Abc_Cex_t *pAVar6;
  abctime aVar7;
  Vec_Int_t *p_00;
  Vec_Int_t *vFlopsNewBest;
  abctime clk;
  int Entry;
  int i;
  Vec_Int_t *vFlopsNew;
  Aig_Man_t *pAbs;
  int fTryFour_local;
  int nFfToAddMax_local;
  Abc_Cex_t *pCex_local;
  Vec_Int_t *vFlopClasses_local;
  Vec_Int_t *vFlops_local;
  Aig_Man_t *p_local;
  
  aVar5 = Abc_Clock();
  pAbs_00 = Saig_ManDupAbstraction(p,vFlops);
  if (fSensePath == 0) {
    iVar1 = Saig_ManCexFirstFlopPi(p,pAbs_00);
    _Entry = Saig_ManExtendCounterExampleTest3(pAbs_00,iVar1,pCex,fVerbose);
  }
  else {
    iVar1 = Saig_ManCexFirstFlopPi(p,pAbs_00);
    _Entry = Saig_ManExtendCounterExampleTest2(pAbs_00,iVar1,pCex,fVerbose);
  }
  if (_Entry == (Vec_Int_t *)0x0) {
    Aig_ManStop(pAbs_00);
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = Vec_IntSize(_Entry);
    if (iVar1 == 0) {
      printf("Refinement did not happen. Discovered a true counter-example.\n");
      uVar2 = Aig_ManCiNum(pAbs_00);
      uVar3 = Aig_ManCiNum(p);
      printf("Remapping counter-example from %d to %d primary inputs.\n",(ulong)uVar2,(ulong)uVar3);
      pAVar6 = Saig_ManCexRemap(p,pAbs_00,pCex);
      p->pSeqModel = pAVar6;
      Vec_IntFree(_Entry);
      Aig_ManStop(pAbs_00);
      p_local._4_4_ = 0;
    }
    else {
      if (fVerbose != 0) {
        uVar2 = Vec_IntSize(_Entry);
        iVar1 = Aig_ManRegNum(p);
        iVar4 = Vec_IntSize(_Entry);
        printf("Adding %d registers to the abstraction (total = %d).  ",(ulong)uVar2,
               (ulong)(uint)(iVar1 + iVar4));
        aVar7 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar7 - aVar5);
      }
      if ((0 < nFfToAddMax) && (iVar1 = Vec_IntSize(_Entry), nFfToAddMax < iVar1)) {
        for (clk._4_4_ = 0; iVar1 = Vec_IntSize(_Entry), clk._4_4_ < iVar1;
            clk._4_4_ = clk._4_4_ + 1) {
          Vec_IntEntry(_Entry,clk._4_4_);
          iVar1 = Saig_ManPiNum(p);
          Vec_IntAddToEntry(_Entry,clk._4_4_,-iVar1);
        }
        p_00 = Saig_ManCbaFilterFlops(p,pCex,vFlopClasses,_Entry,nFfToAddMax);
        iVar1 = Vec_IntSize(p_00);
        if (iVar1 != nFfToAddMax) {
          __assert_fail("Vec_IntSize(vFlopsNewBest) == nFfToAddMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldRef.c"
                        ,0x128,
                        "int Saig_ManCexRefineStep(Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Abc_Cex_t *, int, int, int, int)"
                       );
        }
        uVar2 = Vec_IntSize(_Entry);
        uVar3 = Vec_IntSize(p_00);
        printf("Filtering flops based on cost (%d -> %d).\n",(ulong)uVar2,(ulong)uVar3);
        Vec_IntFree(_Entry);
        for (clk._4_4_ = 0; iVar1 = Vec_IntSize(p_00), _Entry = p_00, clk._4_4_ < iVar1;
            clk._4_4_ = clk._4_4_ + 1) {
          Vec_IntEntry(p_00,clk._4_4_);
          iVar1 = Saig_ManPiNum(p);
          Vec_IntAddToEntry(p_00,clk._4_4_,iVar1);
        }
      }
      for (clk._4_4_ = 0; iVar1 = Vec_IntSize(_Entry), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1)
      {
        iVar1 = Vec_IntEntry(_Entry,clk._4_4_);
        iVar1 = Vec_IntEntry(pAbs_00->vCiNumsOrig,iVar1);
        iVar4 = Saig_ManPiNum(p);
        if (iVar1 < iVar4) {
          __assert_fail("Entry >= Saig_ManPiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldRef.c"
                        ,0x135,
                        "int Saig_ManCexRefineStep(Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Abc_Cex_t *, int, int, int, int)"
                       );
        }
        iVar4 = Aig_ManCiNum(p);
        if (iVar4 <= iVar1) {
          __assert_fail("Entry < Aig_ManCiNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldRef.c"
                        ,0x136,
                        "int Saig_ManCexRefineStep(Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, Abc_Cex_t *, int, int, int, int)"
                       );
        }
        iVar4 = Saig_ManPiNum(p);
        Vec_IntPush(vFlops,iVar1 - iVar4);
      }
      Vec_IntFree(_Entry);
      Aig_ManStop(pAbs_00);
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Saig_ManCexRefineStep( Aig_Man_t * p, Vec_Int_t * vFlops, Vec_Int_t * vFlopClasses, Abc_Cex_t * pCex, int nFfToAddMax, int fTryFour, int fSensePath, int fVerbose )
{
    Aig_Man_t * pAbs;
    Vec_Int_t * vFlopsNew;
    int i, Entry;
    abctime clk = Abc_Clock();
    pAbs = Saig_ManDupAbstraction( p, vFlops );
    if ( fSensePath )
        vFlopsNew = Saig_ManExtendCounterExampleTest2( pAbs, Saig_ManCexFirstFlopPi(p, pAbs), pCex, fVerbose );
    else
//        vFlopsNew = Saig_ManExtendCounterExampleTest( pAbs, Saig_ManCexFirstFlopPi(p, pAbs), pCex, fTryFour, fVerbose );
        vFlopsNew = Saig_ManExtendCounterExampleTest3( pAbs, Saig_ManCexFirstFlopPi(p, pAbs), pCex, fVerbose );
    if ( vFlopsNew == NULL )
    {
        Aig_ManStop( pAbs );
        return 0;
    }
    if ( Vec_IntSize(vFlopsNew) == 0 )
    {
        printf( "Refinement did not happen. Discovered a true counter-example.\n" );
        printf( "Remapping counter-example from %d to %d primary inputs.\n", Aig_ManCiNum(pAbs), Aig_ManCiNum(p) );
        p->pSeqModel = Saig_ManCexRemap( p, pAbs, pCex );
        Vec_IntFree( vFlopsNew );
        Aig_ManStop( pAbs );
        return 0;
    }
    if ( fVerbose )
    {
        printf( "Adding %d registers to the abstraction (total = %d).  ", Vec_IntSize(vFlopsNew), Aig_ManRegNum(p)+Vec_IntSize(vFlopsNew) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    // vFlopsNew contains PI numbers that should be kept in pAbs
    // select the most useful flops among those to be added
    if ( nFfToAddMax > 0 && Vec_IntSize(vFlopsNew) > nFfToAddMax )
    {
        Vec_Int_t * vFlopsNewBest;
        // shift the indices
        Vec_IntForEachEntry( vFlopsNew, Entry, i )
            Vec_IntAddToEntry( vFlopsNew, i, -Saig_ManPiNum(p) );
        // create new flops
        vFlopsNewBest = Saig_ManCbaFilterFlops( p, pCex, vFlopClasses, vFlopsNew, nFfToAddMax );
        assert( Vec_IntSize(vFlopsNewBest) == nFfToAddMax );
        printf( "Filtering flops based on cost (%d -> %d).\n", Vec_IntSize(vFlopsNew), Vec_IntSize(vFlopsNewBest) );
        // update
        Vec_IntFree( vFlopsNew );
        vFlopsNew = vFlopsNewBest;
        // shift the indices
        Vec_IntForEachEntry( vFlopsNew, Entry, i )
            Vec_IntAddToEntry( vFlopsNew, i, Saig_ManPiNum(p) );
    }
    // add to the abstraction
    Vec_IntForEachEntry( vFlopsNew, Entry, i )
    {
        Entry = Vec_IntEntry(pAbs->vCiNumsOrig, Entry);
        assert( Entry >= Saig_ManPiNum(p) );
        assert( Entry < Aig_ManCiNum(p) );
        Vec_IntPush( vFlops, Entry-Saig_ManPiNum(p) );
    }
    Vec_IntFree( vFlopsNew );
    Aig_ManStop( pAbs );
    return 1;
}